

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

Gia_Man_t * Lf_ManPerformMappingInt(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  uint uVar1;
  Vec_Mem_t *p;
  char *pcVar2;
  int iVar3;
  Gia_Man_t *pGia_00;
  Lf_Man_t *p_00;
  FILE *__stream;
  word *pwVar4;
  Gia_Man_t *p_01;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  char local_418 [1000];
  
  if (pPars->fUseMux7 != 0) {
    pPars->fCoarsen = 1;
    pPars->nRoundsEla = 0;
  }
  if ((pGia->pSibls != (int *)0x0) || (pPars->nLutSizeMux != 0)) {
    pPars->fCutMin = 1;
  }
  pGia_00 = pGia;
  if (pPars->fCoarsen != 0) {
    pGia_00 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
    pGia_00->pManTime = pGia->pManTime;
    pGia->pManTime = (void *)0x0;
  }
  p_00 = Lf_ManAlloc(pGia_00,pPars);
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    putchar(10);
    printf("Derived ");
    Gia_ManPrintMuxStats(pGia_00);
    putchar(10);
  }
  Lf_ManPrintInit(p_00);
  iVar3 = 0;
  while( true ) {
    p_00->Iter = iVar3;
    iVar7 = p_00->pPars->nRounds;
    if (iVar7 <= iVar3) break;
    Lf_ManComputeMapping(p_00);
    iVar3 = p_00->Iter + 1;
  }
  p_00->fUseEla = 1;
  while (iVar3 < iVar7 + pPars->nRoundsEla) {
    Lf_ManComputeMapping(p_00);
    iVar3 = p_00->Iter + 1;
    p_00->Iter = iVar3;
    iVar7 = p_00->pPars->nRounds;
  }
  if ((pPars->fVeryVerbose != 0) && (pPars->fCutMin != 0)) {
    p = p_00->vTtMem;
    pcVar2 = p_00->pGia->pName;
    uVar1 = pPars->nLutSize;
    sprintf(local_418,"tt_%s_%02d.txt",pcVar2,(ulong)uVar1);
    __stream = _stdout;
    if ((pcVar2 == (char *)0x0) || (__stream = fopen(local_418,"wb"), _stdout == __stream)) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)p->nEntries);
    }
    iVar3 = 0;
    while ((iVar3 < p->nEntries && (pwVar4 = Vec_MemReadEntry(p,iVar3), pwVar4 != (word *)0x0))) {
      uVar8 = (ulong)(uint)p->nEntrySize;
      while (0 < (int)uVar8) {
        uVar8 = uVar8 - 1;
        bVar9 = 0x3c;
        for (iVar7 = 0xf; -1 < iVar7; iVar7 = iVar7 + -1) {
          uVar6 = (uint)(pwVar4[uVar8] >> (bVar9 & 0x3f)) & 0xf;
          if (uVar6 < 10) {
            fprintf(__stream,"%d");
          }
          else {
            fputc(uVar6 + 0x37,__stream);
          }
          bVar9 = bVar9 - 4;
        }
      }
      fputc(10,__stream);
      iVar3 = iVar3 + 1;
    }
    if (__stream != _stdout) {
      fclose(__stream);
    }
    pcVar5 = local_418;
    if (pcVar2 == (char *)0x0) {
      pcVar5 = "stdout";
    }
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)p->nEntrySize * (double)p->nEntries * 8.0 * 9.5367431640625e-07,
           (ulong)(uint)p->nEntries,(ulong)uVar1,pcVar5);
  }
  if (pPars->fCutMin == 0) {
    if (pPars->fCoarsen == 0) {
      p_01 = Lf_ManDeriveMapping(p_00);
    }
    else {
      p_01 = Lf_ManDeriveMappingCoarse(p_00);
    }
  }
  else {
    p_01 = Lf_ManDeriveMappingGia(p_00);
  }
  Gia_ManMappingVerify(p_01);
  Lf_ManPrintQuit(p_00,p_01);
  Lf_ManFree(p_00);
  if (pGia_00 != pGia) {
    pGia->pManTime = pGia_00->pManTime;
    pGia_00->pManTime = (void *)0x0;
    Gia_ManStop(pGia_00);
  }
  return p_01;
}

Assistant:

Gia_Man_t * Lf_ManPerformMappingInt( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    int fUsePowerMode = 0;
    Lf_Man_t * p;
    Gia_Man_t * pNew, * pCls;
    if ( pPars->fUseMux7 )
        pPars->fCoarsen = 1, pPars->nRoundsEla = 0;
    if ( Gia_ManHasChoices(pGia) || pPars->nLutSizeMux )
        pPars->fCutMin = 1; 
    if ( pPars->fCoarsen )
    {
        pCls = Gia_ManDupMuxes(pGia, pPars->nCoarseLimit);
        pCls->pManTime = pGia->pManTime; pGia->pManTime = NULL;
    }
    else pCls = pGia;
    p = Lf_ManAlloc( pCls, pPars );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Lf_ManPrintInit( p );

    // power mode
    if ( fUsePowerMode && Vec_FltSize(&p->vSwitches) )
        pPars->fPower = 0;

    // perform mapping
    for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
        Lf_ManComputeMapping( p );
    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
        Lf_ManComputeMapping( p );

    // power mode
    if ( fUsePowerMode && Vec_FltSize(&p->vSwitches) )
    {
        pPars->fPower = 1;
        for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla + 2; p->Iter++ )
            Lf_ManComputeMapping( p );
    }

    if ( pPars->fVeryVerbose && pPars->fCutMin )
        Vec_MemDumpTruthTables( p->vTtMem, Gia_ManName(p->pGia), pPars->nLutSize );
    if ( pPars->fCutMin )
        pNew = Lf_ManDeriveMappingGia( p );
    else if ( pPars->fCoarsen )
        pNew = Lf_ManDeriveMappingCoarse( p );
    else
        pNew = Lf_ManDeriveMapping( p );
    Gia_ManMappingVerify( pNew );
    Lf_ManPrintQuit( p, pNew );
    Lf_ManFree( p );
    if ( pCls != pGia )
    {
        pGia->pManTime = pCls->pManTime; pCls->pManTime = NULL;
        Gia_ManStop( pCls );
    }
    return pNew;
}